

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

int32_t __thiscall GameEngine::registerPlayer(GameEngine *this,string *name)

{
  size_type *psVar1;
  size_t __n;
  pointer pcVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  uint __val;
  Player *pPVar9;
  uint __len;
  uint id;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  shared_ptr<Player> player;
  string local_a8;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  Player *local_48;
  shared_ptr<Player> local_40;
  
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00139928;
  pPVar9 = (Player *)
           (local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_use_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_weak_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]._M_use_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]._M_weak_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]._M_use_count
       = 0;
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]._M_weak_count
       = 0;
  *(_Atomic_word **)
   &local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count =
       &local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_use_count;
  id = (uint)((ulong)((long)(this->players).
                            super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->players).
                           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pPVar9;
  Player::SetId(pPVar9,id);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Bot","");
  _Var3._M_p = local_a8._M_dataplus._M_p;
  __n = name->_M_string_length;
  local_48 = pPVar9;
  if (__n == local_a8._M_string_length) {
    if (__n == 0) {
      bVar10 = true;
    }
    else {
      iVar5 = bcmp((name->_M_dataplus)._M_p,local_a8._M_dataplus._M_p,__n);
      bVar10 = iVar5 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_a8.field_2) {
    operator_delete(_Var3._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  pPVar9 = local_48;
  if (!bVar10) {
    Player::SetName(local_48,name);
    goto LAB_00127596;
  }
  local_88 = local_78;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  __val = -id;
  if (0 < (int)id) {
    __val = id;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0012745d;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0012745d;
      }
      if (uVar7 < 10000) goto LAB_0012745d;
      uVar8 = uVar8 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0012745d:
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)-((int)id >> 0x1f) + (char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uint)-((int)id >> 0x1f) + (long)local_68),__len,__val);
  pPVar9 = local_48;
  uVar8 = 0xf;
  if (local_88 != local_78) {
    uVar8 = local_78[0];
  }
  if (uVar8 < (ulong)(local_60 + local_80)) {
    uVar8 = 0xf;
    if (local_68 != local_58) {
      uVar8 = local_58[0];
    }
    if (uVar8 < (ulong)(local_60 + local_80)) goto LAB_001274e6;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_001274e6:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
  }
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8.field_2._8_8_ = puVar6[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_a8._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  Player::SetName(pPVar9,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
LAB_00127596:
  Player::generatePopulations(pPVar9);
  std::vector<std::shared_ptr<Player>,std::allocator<std::shared_ptr<Player>>>::
  emplace_back<std::shared_ptr<Player>>
            ((vector<std::shared_ptr<Player>,std::allocator<std::shared_ptr<Player>>> *)
             &this->players,&local_40);
  if (local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return id;
}

Assistant:

int32_t GameEngine::registerPlayer(const std::string &name) {
  std::shared_ptr<Player> player = std::make_shared<Player>();
  int32_t id = players.size();
  player->SetId(id);

  if (name == std::string("Bot")) {
    player->SetName(name + " " + std::to_string(id));
  } else {
    player->SetName(name);
  }

  player->generatePopulations();

  players.push_back(std::move(player));

  return id;
}